

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void * __thiscall tinyxml2::MemPoolT<96>::Alloc(MemPoolT<96> *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  Chunk *__s;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  
  auVar10 = in_ZMM4._0_16_;
  auVar9 = in_ZMM3._0_32_;
  __s = this->_root;
  if (__s == (Chunk *)0x0) {
    __s = (Chunk *)operator_new(0xfc0);
    lVar6 = 0;
    memset(__s,0,0xfc0);
    DynArray<tinyxml2::MemPoolT<96>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._size = iVar1 + 1;
    (this->_blockPtrs)._mem[iVar1] = (Block *)__s;
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar8._8_8_ = 0x8000000000000028;
    auVar8._0_8_ = 0x8000000000000028;
    auVar9 = vpcmpeqd_avx2(auVar9,auVar9);
    auVar10 = vpcmpeqd_avx(auVar10,auVar10);
    auVar11._8_8_ = 4;
    auVar11._0_8_ = 4;
    auVar11._16_8_ = 4;
    auVar11._24_8_ = 4;
    do {
      auVar12 = vpcmpgtq_avx(auVar3._0_16_ ^ auVar7,auVar8);
      auVar4 = vpsubq_avx2(auVar3,auVar9);
      if ((~auVar12._0_4_ & 1) != 0) {
        *(Chunk **)((long)__s + lVar6) = __s + auVar4._0_8_;
      }
      auVar12 = vpcmpgtq_avx(auVar3._0_16_ ^ auVar7,auVar8);
      auVar12 = vpshufd_avx(auVar12,0xaa);
      if (((auVar12 ^ auVar10) >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        lVar5 = vpextrq_avx(auVar4._0_16_,1);
        *(Chunk **)((long)__s + lVar6 + 0x60) = __s + lVar5;
      }
      auVar12._8_8_ = auVar3._16_8_;
      auVar12._0_8_ = auVar3._16_8_;
      auVar12 = vpcmpgtq_avx(auVar12 ^ auVar7,auVar8);
      if (((auVar12 ^ auVar10) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(Chunk **)((long)__s + lVar6 + 0xc0) = __s + auVar4._16_8_;
      }
      auVar12 = vpcmpgtq_avx(auVar3._16_16_ ^ auVar7,auVar8);
      auVar12 = vpshufd_avx(auVar12,0xaa);
      if (((auVar12 ^ auVar10) >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        lVar5 = vpextrq_avx(auVar4._16_16_,1);
        *(Chunk **)((long)__s + lVar6 + 0x120) = __s + lVar5;
      }
      auVar3 = vpaddq_avx2(auVar3,auVar11);
      lVar6 = lVar6 + 0x180;
    } while (lVar6 != 0x1080);
    __s[0x29].next = (Chunk *)0x0;
    this->_root = __s;
  }
  this->_root = __s->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return __s;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }